

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t_backend.hpp
# Opt level: O1

string * __thiscall
boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>::
str_abi_cxx11_(string *__return_storage_ptr__,void *this,streamsize number_of_digits,
              fmtflags format_flags)

{
  bool bVar1;
  uint_fast8_t base_rep;
  allocator_type local_39;
  vector<char,_std::allocator<char>_> pstr;
  
  std::vector<char,_std::allocator<char>_>::vector(&pstr,0x134d,&local_39);
  base_rep = '\x10';
  if ((format_flags & _S_hex) == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
    base_rep = '\n';
  }
  bVar1 = math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
          wr_string<char*>((uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *)
                           this,pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,base_rep,
                           (bool)((byte)((uint)format_flags >> 9) & 1),
                           (bool)((byte)((uint)format_flags >> 0xb) & 1),
                           (bool)((byte)((uint)format_flags >> 0xe) & 1),0,'0');
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,&local_39);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  if (pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

WIDE_INTEGER_NODISCARD auto str(std::streamsize number_of_digits, const std::ios::fmtflags format_flags) const -> std::string
    {
      static_cast<void>(number_of_digits);

      // Use simple vector dynamic memory here. When using uintwide_t as a
      // Boost.Multiprecision number backend, we assume vector is available.

      std::vector<char>
        pstr
        (
          static_cast<typename std::vector<char>::size_type>(representation_type::wr_string_max_buffer_size_dec())
        );

      const auto base_rep     = static_cast<std::uint_fast8_t>(((format_flags & std::ios::hex) != 0) ? 16U : 10U);
      const auto show_base    = ((format_flags & std::ios::showbase)  != 0);
      const auto show_pos     = ((format_flags & std::ios::showpos)   != 0);
      const auto is_uppercase = ((format_flags & std::ios::uppercase) != 0);

      const auto wr_string_is_ok = m_value.wr_string(pstr.data(), base_rep, show_base, show_pos, is_uppercase);

      return (wr_string_is_ok ? std::string(pstr.data()) : std::string());
    }